

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall CP::vector<int>::vector(vector<int> *this,vector<int> *a)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong __n;
  int *piVar3;
  ulong local_20;
  size_t i;
  vector<int> *a_local;
  vector<int> *this_local;
  
  sVar2 = capacity(a);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(__n);
  memset(piVar3,0,__n);
  this->mData = piVar3;
  sVar2 = capacity(a);
  this->mCap = sVar2;
  sVar2 = size(a);
  this->mSize = sVar2;
  local_20 = 0;
  while( true ) {
    sVar2 = size(a);
    if (sVar2 <= local_20) break;
    piVar3 = operator[](a,(int)local_20);
    this->mData[local_20] = *piVar3;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

vector(const vector<T>& a) {
      mData = new T[a.capacity()]();
      mCap = a.capacity();
      mSize = a.size();
      for (size_t i = 0;i < a.size();i++) {
        mData[i] = a[i];
      }
    }